

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O1

void __thiscall
libtorrent::i2p_stream::
send_accept<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (i2p_stream *this,
          _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *h)

{
  uint uVar1;
  uint uVar2;
  char cmd [400];
  transfer_all_t local_1e9;
  i2p_stream *local_1e8;
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:414:4),_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
  local_1e0;
  mutable_buffer local_1b8;
  char local_1a8 [400];
  
  this->m_state = read_accept_response;
  uVar2 = snprintf(local_1a8,400,"STREAM ACCEPT ID=%s\n",this->m_id);
  uVar1 = 400;
  if (uVar2 < 400) {
    uVar1 = uVar2;
  }
  local_1b8.size_ = (size_t)uVar1;
  local_1e0.m_underlying_handler._M_f = h->_M_f;
  local_1e0.m_underlying_handler._8_8_ = *(undefined8 *)&h->field_0x8;
  local_1e0.m_underlying_handler._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (h->_M_bound_args).
       super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
       .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl
       .super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1e0.m_underlying_handler._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (h->_M_bound_args).
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
         _M_head_impl.
         super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  (h->_M_bound_args).
  super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (h->_M_bound_args).
  super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1e8 = this;
  local_1e0.m_handler.this = this;
  local_1b8.data_ = local_1a8;
  boost::asio::detail::
  initiate_async_write_buffer_sequence<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>>
  ::operator()((initiate_async_write_buffer_sequence<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>>
                *)&local_1e8,&local_1e0,&local_1b8,&local_1e9);
  if (local_1e0.m_underlying_handler._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e0.m_underlying_handler._M_bound_args.
               super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
               .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
               _M_head_impl.
               super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void send_accept(Handler h)
	{
		TORRENT_ASSERT(m_magic == 0x1337);
		m_state = read_accept_response;
		char cmd[400];
		int size = std::snprintf(cmd, sizeof(cmd), "STREAM ACCEPT ID=%s\n", m_id);
		ADD_OUTSTANDING_ASYNC("i2p_stream::start_read_line");
		async_write(m_sock, boost::asio::buffer(cmd, std::size_t(size)), aux::wrap_allocator(
			[this](error_code const& ec, std::size_t, Handler hn) {
				start_read_line(ec, std::move(hn));
			}, std::move(h)));
	}